

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Utility::JsonToken,_void_(*)(Corrade::Utility::JsonToken_*,_unsigned_long)>::
operator()(CallDeleter<Corrade::Utility::JsonToken,_void_(*)(Corrade::Utility::JsonToken_*,_unsigned_long)>
           *this,_func_void_JsonToken_ptr_size_t *deleter,JsonToken *data,size_t size)

{
  if (deleter != (_func_void_JsonToken_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (JsonToken *)0x0) {
    operator_delete__(data);
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }